

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_io.cpp
# Opt level: O2

int main(void)

{
  MakeNet *pMVar1;
  code *__nbytes;
  void *__buf;
  initializer_list<unsigned_long> __l;
  PlainTextNetworkWriter local_230;
  Net mlp_copy;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  code *local_1e0 [2];
  code *local_1d0;
  code *local_1c8;
  Net mlp;
  stringstream ss;
  _func_int *local_180 [47];
  
  notch::core::MakeNet::MakeNet((MakeNet *)&ss,0);
  mlp_copy._vptr_Net = (_func_int **)0x2;
  mlp_copy.layers.
  super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  mlp_copy.layers.
  super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
  __l._M_len = 3;
  __l._M_array = (iterator)&mlp_copy;
  notch::core::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1f8,__l,
             (allocator_type *)&local_230);
  pMVar1 = notch::core::MakeNet::MultilayerPerceptron
                     ((MakeNet *)&ss,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1f8,
                      (Activation *)notch::core::scaledTanh);
  pMVar1 = notch::core::MakeNet::addL2Loss(pMVar1);
  local_1e0[1] = (code *)0x0;
  local_1e0[0] = notch::core::Init::normalXavier;
  local_1c8 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_invoke;
  __nbytes = notch::core::std::
             _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
             ::_M_manager;
  local_1d0 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_manager;
  notch::core::MakeNet::init((MakeNet *)&mlp,(EVP_PKEY_CTX *)pMVar1);
  notch::core::std::_Function_base::~_Function_base((_Function_base *)local_1e0);
  notch::core::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1f8);
  notch::core::MakeNet::~MakeNet((MakeNet *)&ss);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  mlp_copy._vptr_Net = local_180;
  notch::io::PlainTextNetworkWriter::save((PlainTextNetworkWriter *)&mlp_copy,&mlp);
  std::operator<<((ostream *)&std::cout,"saved:\n\n```\n");
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&std::cout,(string *)&mlp_copy);
  std::__cxx11::string::~string((string *)&mlp_copy);
  std::operator<<((ostream *)&std::cout,"```\n\n");
  std::istream::seekg(&ss,0,0);
  local_230.out = (ostream *)&ss;
  notch::io::PlainTextNetworkReader::read
            ((PlainTextNetworkReader *)&mlp_copy,(int)&local_230,__buf,(size_t)__nbytes);
  std::operator<<((ostream *)&std::cout,"loaded:\n\n```\n");
  local_230.out = (ostream *)&std::cout;
  notch::io::PlainTextNetworkWriter::save(&local_230,&mlp_copy);
  std::operator<<((ostream *)&std::cout,"```\n\n");
  notch::core::Net::~Net(&mlp_copy);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  notch::core::Net::~Net(&mlp);
  return 0;
}

Assistant:

int main() {

    // create a multilayer perceptron and save it to a string stream
    Net mlp = MakeNet().MultilayerPerceptron({2, 2, 1}).addL2Loss().init();
    stringstream ss;
    PlainTextNetworkWriter(ss) << mlp;

    // show original
    cout << "saved:\n\n```\n";
    cout << ss.str();
    cout << "```\n\n";

    // read a copy of the multilayer perceptron from the string stream
    ss.seekg(0);
    Net mlp_copy = PlainTextNetworkReader(ss).read();

    // show a copy
    cout << "loaded:\n\n```\n";
    PlainTextNetworkWriter(cout) << mlp_copy;
    cout << "```\n\n";
}